

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateDescriptorMethods
          (ImmutableMessageGenerator *this,Printer *printer)

{
  ClassNameResolver *pCVar1;
  Printer *pPVar2;
  bool bVar3;
  int iVar4;
  JavaType JVar5;
  int iVar6;
  MessageOptions *this_00;
  FileDescriptor *pFVar7;
  Descriptor *descriptor;
  reference ppFVar8;
  Descriptor *descriptor_00;
  AlphaNum *a;
  Descriptor *descriptor_01;
  string local_1c8;
  string local_1a8;
  string local_188;
  string_view local_168;
  string_view local_158;
  string_view local_148;
  AlphaNum local_138;
  string local_108;
  string_view local_e8;
  FieldGeneratorInfo *local_d8;
  FieldGeneratorInfo *info;
  FieldDescriptor *field_1;
  iterator __end4;
  iterator __begin4;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range4;
  FieldDescriptor *local_a0;
  FieldDescriptor *field;
  undefined1 local_90 [4];
  int i;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  map_fields;
  string local_68;
  string local_48;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMessageGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  this_00 = Descriptor::options((this->super_MessageGenerator).descriptor_);
  bVar3 = MessageOptions::no_standard_descriptor_accessor(this_00);
  pPVar2 = local_18;
  if (!bVar3) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,
               "public static final com.google.protobuf.Descriptors.Descriptor\n    getDescriptor() {\n  return $fileclass$.internal_$identifier$_descriptor;\n}\n\n"
              );
    pCVar1 = this->name_resolver_;
    pFVar7 = Descriptor::file((this->super_MessageGenerator).descriptor_);
    ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
              (&local_48,pCVar1,pFVar7);
    UniqueFileScopeIdentifier_abi_cxx11_
              (&local_68,(java *)(this->super_MessageGenerator).descriptor_,descriptor_00);
    io::Printer::Print<char[10],std::__cxx11::string,char[11],std::__cxx11::string>
              (pPVar2,local_28,(char (*) [10])"fileclass",&local_48,(char (*) [11])0xa28a0f,
               &local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_90);
  for (field._4_4_ = 0; iVar6 = field._4_4_,
      iVar4 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar6 < iVar4;
      field._4_4_ = field._4_4_ + 1) {
    local_a0 = Descriptor::field((this->super_MessageGenerator).descriptor_,field._4_4_);
    JVar5 = GetJavaType(local_a0);
    if (JVar5 == JAVATYPE_MESSAGE) {
      descriptor = FieldDescriptor::message_type(local_a0);
      bVar3 = IsMapEntry(descriptor);
      if (bVar3) {
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)local_90,&local_a0);
      }
    }
  }
  bVar3 = std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::empty((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)local_90);
  pPVar2 = local_18;
  if (!bVar3) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range4,
               "@SuppressWarnings({\"rawtypes\"})\n@java.lang.Override\nprotected com.google.protobuf.MapFieldReflectionAccessor internalGetMapFieldReflection(\n    int number) {\n  switch (number) {\n"
              );
    io::Printer::Print<>(pPVar2,___range4);
    io::Printer::Indent(local_18);
    io::Printer::Indent(local_18);
    __end4 = std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      *)local_90);
    field_1 = (FieldDescriptor *)
              std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)local_90);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                       *)&field_1), pPVar2 = local_18, bVar3) {
      ppFVar8 = __gnu_cxx::
                __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                ::operator*(&__end4);
      info = (FieldGeneratorInfo *)*ppFVar8;
      local_d8 = Context::GetFieldGeneratorInfo(this->context_,(FieldDescriptor *)info);
      pPVar2 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_e8,"case $number$:\n  return internalGet$capitalized_name$();\n");
      iVar6 = FieldDescriptor::number((FieldDescriptor *)info);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_138,iVar6);
      absl::lts_20250127::StrCat_abi_cxx11_(&local_108,(lts_20250127 *)&local_138,a);
      io::Printer::Print<char[7],std::__cxx11::string,char[17],std::__cxx11::string>
                (pPVar2,local_e8,(char (*) [7])0xbe447d,&local_108,(char (*) [17])0xaa4e7b,
                 &local_d8->capitalized_name);
      std::__cxx11::string::~string((string *)&local_108);
      __gnu_cxx::
      __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
      ::operator++(&__end4);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_148,
               "default:\n  throw new RuntimeException(\n      \"Invalid map field number: \" + number);\n"
              );
    io::Printer::Print<>(pPVar2,local_148);
    io::Printer::Outdent(local_18);
    io::Printer::Outdent(local_18);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_158,"  }\n}\n");
    io::Printer::Print<>(pPVar2,local_158);
  }
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_168,
             "@java.lang.Override\nprotected com.google.protobuf.GeneratedMessage.FieldAccessorTable\n    internalGetFieldAccessorTable() {\n  return $fileclass$.internal_$identifier$_fieldAccessorTable\n      .ensureFieldAccessorsInitialized(\n          $classname$.class, $classname$.Builder.class);\n}\n\n"
            );
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_188,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  pCVar1 = this->name_resolver_;
  pFVar7 = Descriptor::file((this->super_MessageGenerator).descriptor_);
  ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
            (&local_1a8,pCVar1,pFVar7);
  UniqueFileScopeIdentifier_abi_cxx11_
            (&local_1c8,(java *)(this->super_MessageGenerator).descriptor_,descriptor_01);
  io::Printer::
  Print<char[10],std::__cxx11::string,char[10],std::__cxx11::string,char[11],std::__cxx11::string>
            (pPVar2,local_168,(char (*) [10])0xa117a7,&local_188,(char (*) [10])"fileclass",
             &local_1a8,(char (*) [11])0xa28a0f,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_188);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_90);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateDescriptorMethods(
    io::Printer* printer) {
  if (!descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print(
        "public static final com.google.protobuf.Descriptors.Descriptor\n"
        "    getDescriptor() {\n"
        "  return $fileclass$.internal_$identifier$_descriptor;\n"
        "}\n"
        "\n",
        "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
        "identifier", UniqueFileScopeIdentifier(descriptor_));
  }
  std::vector<const FieldDescriptor*> map_fields;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (GetJavaType(field) == JAVATYPE_MESSAGE &&
        IsMapEntry(field->message_type())) {
      map_fields.push_back(field);
    }
  }
  if (!map_fields.empty()) {
    printer->Print(
        "@SuppressWarnings({\"rawtypes\"})\n"
        "@java.lang.Override\n"
        "protected com.google.protobuf.MapFieldReflectionAccessor "
        "internalGetMapFieldReflection(\n"
        "    int number) {\n"
        "  switch (number) {\n");
    printer->Indent();
    printer->Indent();
    for (const FieldDescriptor* field : map_fields) {
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      printer->Print(
          "case $number$:\n"
          "  return internalGet$capitalized_name$();\n",
          "number", absl::StrCat(field->number()), "capitalized_name",
          info->capitalized_name);
    }
    printer->Print(
        "default:\n"
        "  throw new RuntimeException(\n"
        "      \"Invalid map field number: \" + number);\n");
    printer->Outdent();
    printer->Outdent();
    printer->Print(
        "  }\n"
        "}\n");
  }
  printer->Print(
      "@java.lang.Override\n"
      "protected com.google.protobuf.GeneratedMessage.FieldAccessorTable\n"
      "    internalGetFieldAccessorTable() {\n"
      "  return $fileclass$.internal_$identifier$_fieldAccessorTable\n"
      "      .ensureFieldAccessorsInitialized(\n"
      "          $classname$.class, $classname$.Builder.class);\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
      "identifier", UniqueFileScopeIdentifier(descriptor_));
}